

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O1

void __thiscall KDReports::Test::testSingleHeader(Test *this)

{
  char cVar1;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  Report report;
  long local_30;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  pvVar2 = (void *)KDReports::Report::header(&report,6);
  if (*(long *)(local_30 + 0x78) == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = *(long *)(*(long *)(local_30 + 0x78) + 0x30) != 0;
  }
  cVar1 = QTest::qVerify(bVar7,"!headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x29);
  if (cVar1 != '\0') {
    iVar6 = (int)local_30 + 0x78;
    pvVar3 = (void *)KDReports::HeaderMap::headerForPage(iVar6,1);
    pcVar4 = (char *)QTest::toString(pvVar3);
    pcVar5 = (char *)QTest::toString(pvVar2);
    cVar1 = QTest::compare_helper
                      (pvVar3 == pvVar2,"Compared pointers are not the same",pcVar4,pcVar5,
                       "headers.headerForPage(1, 2)","&theHeader",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x2a);
    if (cVar1 != '\0') {
      pvVar3 = (void *)KDReports::HeaderMap::headerForPage(iVar6,2);
      pcVar4 = (char *)QTest::toString(pvVar3);
      pcVar5 = (char *)QTest::toString(pvVar2);
      QTest::compare_helper
                (pvVar3 == pvVar2,"Compared pointers are not the same",pcVar4,pcVar5,
                 "headers.headerForPage(2, 2)","&theHeader",
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                 ,0x2b);
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testSingleHeader()
    {
        Report report;
        Header &theHeader = report.header();
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(!headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 2), &theHeader);
        QCOMPARE(headers.headerForPage(2, 2), &theHeader);
    }